

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManComputeMappingEla(Nf_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  int *piVar3;
  Nf_Obj_t *pNVar4;
  void *pvVar5;
  Mio_Cell2_t *pMVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  Gia_Man_t *pGVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  Nf_Mat_t *pNVar26;
  Nf_Mat_t *pNVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  bool bVar30;
  Nf_Mat_t Mb;
  Nf_Mat_t local_48;
  ulong local_38;
  
  Nf_ManSetOutputRequireds(p,1);
  Nf_ManResetMatches(p,p->Iter - p->pPars->nRounds);
  pGVar13 = p->pGia;
  lVar22 = (long)pGVar13->nObjs;
  if (1 < (long)pGVar13->nObjs) {
    do {
      pGVar13 = p->pGia;
      if (pGVar13->nObjs < lVar22) goto LAB_00793ab5;
      if (pGVar13->pObjs == (Gia_Obj_t *)0x0) goto LAB_0079393b;
      lVar11 = lVar22 + -1;
      pGVar1 = pGVar13->pObjs + lVar11;
      uVar21 = *(ulong *)pGVar1;
      uVar15 = (uint)uVar21;
      if ((~uVar15 & 0x1fffffff) != 0 && -1 < (int)uVar15) {
        uVar15 = uVar15 & 0x1fffffff;
        uVar12 = lVar11 * 2;
        iVar17 = (int)lVar11;
        if ((uVar15 == 0x1fffffff) || (uVar15 != ((uint)(uVar21 >> 0x20) & 0x1fffffff))) {
          local_38 = uVar12 & 0xffffffff;
          uVar21 = 0;
          bVar30 = true;
          do {
            bVar10 = bVar30;
            uVar12 = uVar21 | local_38;
            if ((p->vMapRefs).nSize <= (int)uVar12) goto LAB_007939dc;
            if ((p->vMapRefs).pArray[uVar12] != 0) {
              pNVar4 = p->pNfObjs;
              uVar15 = *(uint *)pNVar4[lVar11].M[uVar21];
              uVar16 = *(uint *)(pNVar4[lVar11].M[uVar21] + 1);
              if (-1 < (int)(uVar16 ^ uVar15)) {
LAB_007939fb:
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                              ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              pNVar26 = (Nf_Mat_t *)0x0;
              if ((int)uVar15 < 0) {
                pNVar26 = pNVar4[lVar11].M[uVar21];
              }
              if ((int)uVar16 < 0) {
                pNVar26 = pNVar4[lVar11].M[uVar21] + 1;
              }
              if ((p->vRequired).nSize <= (int)uVar12) goto LAB_007939dc;
              iVar19 = (p->vRequired).pArray[uVar12];
              if (iVar19 < pNVar26->D) {
                __assert_fail("pM->D <= Required",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                              ,0x7b2,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              if ((pNVar26->field_0x3 & 0x40) == 0) {
                iVar24 = (int)uVar21;
                Nf_MatchDeref_rec(p,iVar17,iVar24,pNVar26);
                if (-1 < *(int *)pNVar26) {
                  __assert_fail("pM->fBest",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x7b8,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                Nf_ManElaBestMatch(p,iVar17,iVar24,&local_48,iVar19);
                Nf_MatchRef_rec(p,iVar17,iVar24,&local_48,iVar19,(Vec_Int_t *)0x0);
                if (-1 < (int)local_48._0_4_) {
                  __assert_fail("pMb->fBest",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x7c9,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                if (iVar19 < local_48.D) {
                  __assert_fail("pMb->D <= Required",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x7ca,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                *(ulong *)pNVar26 = CONCAT44(local_48.Cfg,local_48._0_4_);
                pNVar26->D = local_48.D;
                pNVar26->F = local_48.F;
                if ((p->vCutSets).nSize < lVar22) goto LAB_007939dc;
                uVar15 = (p->vCutSets).pArray[lVar11];
                uVar16 = (int)uVar15 >> 0x10;
                if (((int)uVar16 < 0) || ((p->vPages).nSize <= (int)uVar16)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar18 = (uint)local_48._0_4_ >> 0x14 & 0x3ff;
                if (uVar18 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x94,"int *Nf_CutFromHandle(int *, int)");
                }
                uVar15 = uVar15 & 0xffff;
                pvVar5 = (p->vPages).pArray[uVar16];
                if ((*(byte *)((long)pvVar5 + (ulong)uVar18 * 4 + (ulong)uVar15 * 4) & 0x1f) != 0) {
                  pMVar6 = p->pCells;
                  puVar2 = (uint *)((long)pvVar5 + (ulong)uVar18 * 4 + (ulong)uVar15 * 4);
                  lVar9 = (ulong)((local_48._0_4_ & 0xfffff) * 0x50) + 0x2c;
                  bVar14 = 0;
                  uVar21 = 0;
                  do {
                    uVar15 = puVar2[(ulong)(((uint)local_48.Cfg >> 8) >> (bVar14 & 0x1f) & 0xf) + 1]
                    ;
                    lVar23 = (long)(int)uVar15;
                    if (lVar23 == 0) break;
                    bVar30 = (((uint)local_48.Cfg >> 1 & 0x7f) >> ((uint)uVar21 & 0x1f) & 1) != 0;
                    pNVar4 = p->pNfObjs;
                    uVar16 = *(uint *)pNVar4[lVar23].M[bVar30];
                    uVar18 = *(uint *)(pNVar4[lVar23].M[bVar30] + 1);
                    if (-1 < (int)(uVar18 ^ uVar16)) goto LAB_007939fb;
                    if ((int)uVar16 < 0) {
                      pNVar26 = pNVar4[lVar23].M[bVar30];
                    }
                    else {
                      pNVar26 = (Nf_Mat_t *)0x0;
                    }
                    pNVar27 = pNVar4[lVar23].M[bVar30] + 1;
                    if (-1 < (int)uVar18) {
                      pNVar27 = pNVar26;
                    }
                    iVar24 = iVar19 - *(int *)((long)pMVar6->iDelays + uVar21 * 4 + lVar9 + -0x2c);
                    if (iVar24 < ((Nf_Mat_t *)&pNVar27->field_0x0)->D) {
                      __assert_fail("pM->D <= Required - pCell->iDelays[k]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                    ,0x7d4,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                    }
                    if ((int)uVar15 < 0) goto LAB_00793a1a;
                    uVar16 = (uint)bVar30 + uVar15 * 2;
                    if ((p->vRequired).nSize <= (int)uVar16) goto LAB_007939dc;
                    piVar3 = (p->vRequired).pArray;
                    if (iVar24 < piVar3[uVar16]) {
                      piVar3[uVar16] = iVar24;
                    }
                    if ((((Nf_Mat_t *)&pNVar27->field_0x0)->field_0x3 & 0x40) != 0) {
                      uVar25 = (bVar30 ^ 1) << 5;
                      uVar16 = *(uint *)(&pNVar4[lVar23].M[0][0].field_0x0 + uVar25);
                      uVar18 = *(uint *)(&pNVar4[lVar23].M[0][1].field_0x0 + uVar25);
                      if (-1 < (int)(uVar18 ^ uVar16)) goto LAB_007939fb;
                      if ((int)uVar16 < 0) {
                        puVar29 = &pNVar4[lVar23].M[0][0].field_0x0 + uVar25;
                      }
                      else {
                        puVar29 = (undefined1 *)0x0;
                      }
                      puVar28 = &pNVar4[lVar23].M[0][1].field_0x0 + uVar25;
                      if (-1 < (int)uVar18) {
                        puVar28 = puVar29;
                      }
                      iVar24 = iVar19 - (*(int *)((long)pMVar6->iDelays + uVar21 * 4 + lVar9 + -0x2c
                                                 ) + p->InvDelayI);
                      if (iVar24 < *(int *)(puVar28 + 8)) {
                        __assert_fail("pM->D <= Required - pCell->iDelays[k] - p->InvDelayI",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                      ,0x7d9,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                      }
                      uVar15 = bVar30 ^ 1 | uVar15 * 2;
                      if ((p->vRequired).nSize <= (int)uVar15) goto LAB_007939dc;
                      if (iVar24 < piVar3[uVar15]) {
                        piVar3[uVar15] = iVar24;
                      }
                    }
                    uVar21 = uVar21 + 1;
                    bVar14 = bVar14 + 4;
                  } while (uVar21 < (*puVar2 & 0x1f));
                }
              }
            }
            uVar21 = 1;
            bVar30 = false;
          } while (bVar10);
        }
        else {
          uVar20 = uVar12 | 1;
          if ((long)(p->vMapRefs).nSize <= (long)uVar20) goto LAB_007939dc;
          uVar16 = (p->vRequired).nSize;
          if ((p->vMapRefs).pArray[uVar20] != 0) {
            if ((long)(int)uVar16 <= (long)uVar20) goto LAB_007939dc;
            piVar3 = (p->vRequired).pArray;
            iVar19 = piVar3[uVar20] - p->InvDelayI;
            if (iVar19 < piVar3[lVar11 * 2]) {
              piVar3[lVar11 * 2] = iVar19;
              uVar15 = *(uint *)pGVar1;
              uVar21 = (ulong)uVar15;
              uVar16 = (p->vRequired).nSize;
              uVar15 = uVar15 & 0x1fffffff;
            }
          }
          if ((long)(int)uVar16 <= (long)uVar12) goto LAB_007939dc;
          if ((int)(iVar17 - uVar15) < 0) {
LAB_00793a1a:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          uVar15 = ((uint)(uVar21 >> 0x1d) & 1) + (iVar17 - uVar15) * 2;
          if (uVar16 <= uVar15) goto LAB_007939dc;
          piVar3 = (p->vRequired).pArray;
          if (piVar3[lVar11 * 2] < piVar3[uVar15]) {
            piVar3[uVar15] = piVar3[lVar11 * 2];
          }
        }
      }
      bVar30 = 2 < lVar22;
      lVar22 = lVar11;
    } while (bVar30);
    pGVar13 = p->pGia;
  }
LAB_0079393b:
  pVVar7 = pGVar13->vCis;
  iVar17 = pVVar7->nSize;
  if (0 < iVar17) {
    piVar3 = pVVar7->pArray;
    iVar19 = 1;
    lVar22 = 0;
    do {
      uVar15 = piVar3[lVar22];
      uVar21 = (ulong)uVar15;
      if (((int)uVar15 < 0) || (pGVar13->nObjs <= (int)uVar15)) {
LAB_00793ab5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar21 == 0) {
        return;
      }
      lVar11 = uVar21 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar11) goto LAB_007939dc;
      if ((p->vMapRefs).pArray[lVar11] != 0) {
        uVar15 = (p->vRequired).nSize;
        if (((int)uVar15 <= iVar19) || (uVar15 <= (uint)(uVar21 * 2))) {
LAB_007939dc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar8 = (p->vRequired).pArray;
        iVar24 = piVar8[lVar22 * 2 + 1] - p->InvDelayI;
        uVar21 = uVar21 * 2 & 0xffffffff;
        if (iVar24 < piVar8[uVar21]) {
          piVar8[uVar21] = iVar24;
          iVar17 = pVVar7->nSize;
        }
      }
      lVar22 = lVar22 + 1;
      iVar19 = iVar19 + 2;
    } while (lVar22 < iVar17);
  }
  return;
}

Assistant:

void Nf_ManComputeMappingEla( Nf_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    Nf_Mat_t Mb, * pMb = &Mb, * pM;
    word AreaBef, AreaAft, Gain = 0;
    int i, c, iVar, Id, fCompl, k, * pCut;
    int Required;
    Nf_ManSetOutputRequireds( p, 1 );
    Nf_ManResetMatches( p, p->Iter - p->pPars->nRounds );
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Nf_ObjUpdateRequired( p, i, 0, Nf_ObjRequired(p, i, 1) - p->InvDelayI );
            Nf_ObjUpdateRequired( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj), Nf_ObjRequired(p, i, 0) );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            Required = Nf_ObjRequired( p, i, c );
            assert( pM->D <= Required );
            if ( pM->fCompl )
                continue;
            // search for a better match
            assert( !pM->fCompl );
            AreaBef = Nf_MatchDeref_rec( p, i, c, pM );
            assert( pM->fBest );
            Nf_ManElaBestMatch( p, i, c, pMb, Required );
            AreaAft = Nf_MatchRef_rec( p, i, c, pMb, Required, NULL );
            Gain += AreaBef - AreaAft;
            // print area recover progress
            if ( fVerbose && Nf_ManCell(p, pM->Gate)->pName != Nf_ManCell(p, pMb->Gate)->pName )
            {
                printf( "%4d (%d)  ", i, c );
                printf( "%8s ->%8s  ",         Nf_ManCell(p, pM->Gate)->pName, Nf_ManCell(p, pMb->Gate)->pName );
                printf( "%d -> %d  ",          Nf_ManCell(p, pM->Gate)->nFanins, Nf_ManCell(p, pMb->Gate)->nFanins );
                printf( "D: %7.2f -> %7.2f  ", Scl_Int2Flt(pM->D), Scl_Int2Flt(pMb->D) );
                printf( "R: %7.2f  ",          Required == SCL_INFINITY ? 9999.99 : Scl_Int2Flt(Required) );
                printf( "A: %7.2f -> %7.2f  ", Scl_Int2Flt((int)AreaBef), Scl_Int2Flt((int)AreaAft) );
                printf( "G: %7.2f (%7.2f) ",   Scl_Int2Flt((int)AreaBef - (int)AreaAft), Scl_Int2Flt((int)Gain) );
                printf( "\n" );
            }
            // set best match
            assert( pMb->fBest );
            assert( pMb->D <= Required );
            //assert( Scl_Flt2Int(pMb->F) == (int)AreaAft );
            //assert( AreaBef >= AreaAft );
            *pM = *pMb;
            // update timing
            pCell = Nf_ManCell( p, pMb->Gate );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pMb->CutH );
            Nf_CutForEachVarCompl( pCut, pMb->Cfg, iVar, fCompl, k )
            {
                pM = Nf_ObjMatchBest( p, iVar, fCompl );
                assert( pM->D <= Required - pCell->iDelays[k] );
                Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
                if ( pM->fCompl )
                {
                    pM = Nf_ObjMatchBest( p, iVar, !fCompl );
                    assert( pM->D <= Required - pCell->iDelays[k] - p->InvDelayI );
                    Nf_ObjUpdateRequired( p, iVar, !fCompl, Required - pCell->iDelays[k] - p->InvDelayI );
                }
            }
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            Required = Nf_ObjRequired( p, i, 1 );
            Nf_ObjUpdateRequired( p, Id, 0, Required - p->InvDelayI );
        }
}